

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

void ff_add_any(flexfloat_t *dest,flexfloat_t *a,flexfloat_t *b)

{
  dest->value = a->value + b->value;
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_add_any(flexfloat_t *dest, const flexfloat_t *a, const flexfloat_t *b) {
    dest->value = a->value + b->value;
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = a->exact_value + b->exact_value;
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->add += 1;
    #endif
}